

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup3.c
# Opt level: O2

void poptJlu32lpair(void *key,size_t size,uint32_t *pc,uint32_t *pb)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  
  uVar4 = (int)size + *pc + 0xdeadbeef;
  uVar1 = uVar4;
  if (key != (void *)0x0) {
    uVar1 = *pb + uVar4;
    uVar7 = uVar4;
    if (((ulong)key & 3) != 0) {
      if (((ulong)key & 1) != 0) {
        pbVar3 = (byte *)((long)key + 0xb);
        do {
          switch(size) {
          case 0:
            goto switchD_001070aa_caseD_0;
          case 0xc:
            uVar1 = uVar1 + (uint)*pbVar3 * 0x1000000;
          case 0xb:
            uVar1 = uVar1 + (uint)pbVar3[-1] * 0x10000;
          case 10:
            uVar1 = uVar1 + (uint)pbVar3[-2] * 0x100;
          case 9:
            uVar1 = uVar1 + pbVar3[-3];
          case 8:
            uVar7 = uVar7 + (uint)pbVar3[-4] * 0x1000000;
          case 7:
            uVar7 = uVar7 + (uint)pbVar3[-5] * 0x10000;
          case 6:
            uVar7 = uVar7 + (uint)pbVar3[-6] * 0x100;
          case 5:
            uVar7 = uVar7 + pbVar3[-7];
          case 4:
            uVar4 = uVar4 + (uint)pbVar3[-8] * 0x1000000;
          case 3:
            uVar4 = uVar4 + (uint)pbVar3[-9] * 0x10000;
          case 2:
            uVar4 = uVar4 + (uint)pbVar3[-10] * 0x100;
          case 1:
            uVar5 = (uint)pbVar3[-0xb];
            goto LAB_001071a8;
          default:
            iVar2 = (uint)pbVar3[-4] * 0x1000000 + (uint)pbVar3[-5] * 0x10000 +
                    (uint)pbVar3[-6] * 0x100 + uVar7 + pbVar3[-7];
            uVar7 = (uint)*pbVar3 * 0x1000000 + (uint)pbVar3[-1] * 0x10000 +
                    (uint)pbVar3[-2] * 0x100 + uVar1 + pbVar3[-3];
            uVar1 = (uVar7 * 0x10 | uVar7 >> 0x1c) ^
                    ((uint)pbVar3[-8] * 0x1000000 + (uint)pbVar3[-9] * 0x10000 +
                    (uint)pbVar3[-10] * 0x100 + uVar4 + pbVar3[-0xb]) - uVar7;
            iVar6 = uVar7 + iVar2;
            uVar4 = (uVar1 << 6 | uVar1 >> 0x1a) ^ iVar2 - uVar1;
            iVar2 = uVar1 + iVar6;
            uVar1 = (uVar4 << 8 | uVar4 >> 0x18) ^ iVar6 - uVar4;
            iVar6 = uVar4 + iVar2;
            uVar4 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar2 - uVar1;
            iVar2 = uVar1 + iVar6;
            uVar7 = (uVar4 << 0x13 | uVar4 >> 0xd) ^ iVar6 - uVar4;
            uVar4 = uVar4 + iVar2;
            uVar1 = (uVar7 << 4 | uVar7 >> 0x1c) ^ iVar2 - uVar7;
            uVar7 = uVar7 + uVar4;
            size = size - 0xc;
            pbVar3 = pbVar3 + 0xc;
          }
        } while( true );
      }
LAB_00106e8f:
      switch(size) {
      case 0:
        goto switchD_001070aa_caseD_0;
      case 1:
        uVar5 = (uint)(byte)*key;
        goto LAB_001071c7;
      case 2:
        goto switchD_001070aa_caseD_2;
      case 3:
        uVar4 = uVar4 + (uint)*(byte *)((long)key + 2) * 0x10000;
        goto switchD_001070aa_caseD_2;
      case 4:
        goto switchD_001070aa_caseD_4;
      case 5:
        uVar5 = (uint)(byte)*(uint *)((long)key + 4);
        goto LAB_001071c1;
      case 6:
        goto switchD_001070aa_caseD_6;
      case 7:
        uVar7 = uVar7 + (uint)*(byte *)((long)key + 6) * 0x10000;
switchD_001070aa_caseD_6:
        uVar5 = (uint)(ushort)*(uint *)((long)key + 4);
LAB_001071c1:
        uVar7 = uVar7 + uVar5;
        goto switchD_001070aa_caseD_4;
      case 8:
        break;
      case 9:
        uVar1 = uVar1 + (byte)*(uint *)((long)key + 8);
        break;
      case 10:
        goto switchD_001070aa_caseD_a;
      case 0xb:
        uVar1 = uVar1 + (uint)*(byte *)((long)key + 10) * 0x10000;
switchD_001070aa_caseD_a:
        uVar7 = uVar7 + *(uint *)((long)key + 4);
        uVar1 = uVar1 + (ushort)*(uint *)((long)key + 8);
        goto switchD_001070aa_caseD_4;
      case 0xc:
        uVar1 = uVar1 + *(uint *)((long)key + 8);
        break;
      default:
        goto switchD_001070aa_default;
      }
      uVar7 = uVar7 + *(uint *)((long)key + 4);
switchD_001070aa_caseD_4:
      uVar5 = *key;
LAB_001071c7:
      uVar5 = uVar4 + uVar5;
      goto LAB_001071ca;
    }
LAB_00106f14:
    switch(size) {
    case 0:
      goto switchD_001070aa_caseD_0;
    case 1:
      uVar5 = (uint)(byte)*key;
      goto LAB_001071a8;
    case 2:
      goto switchD_001070aa_caseD_2;
    case 3:
      uVar5 = *key & 0xffffff;
      goto LAB_001071a8;
    case 4:
      goto switchD_00106f98_caseD_4;
    case 5:
      uVar5 = (uint)(byte)*(uint *)((long)key + 4);
      break;
    case 6:
      uVar5 = (uint)(ushort)*(uint *)((long)key + 4);
      break;
    case 7:
      uVar5 = *(uint *)((long)key + 4) & 0xffffff;
      break;
    case 8:
      goto switchD_00106f98_caseD_8;
    case 9:
      uVar5 = (uint)(byte)*(uint *)((long)key + 8);
      goto LAB_0010716b;
    case 10:
      uVar5 = (uint)(ushort)*(uint *)((long)key + 8);
      goto LAB_0010716b;
    case 0xb:
      uVar5 = *(uint *)((long)key + 8) & 0xffffff;
LAB_0010716b:
      uVar1 = uVar1 + uVar5;
switchD_00106f98_caseD_8:
      uVar7 = uVar7 + *(uint *)((long)key + 4);
      goto switchD_00106f98_caseD_4;
    case 0xc:
      uVar1 = uVar1 + *(uint *)((long)key + 8);
      goto switchD_00106f98_caseD_8;
    default:
      goto switchD_00106f98_default;
    }
    uVar7 = uVar7 + uVar5;
switchD_00106f98_caseD_4:
    uVar5 = *key;
    goto LAB_001071a8;
  }
LAB_00107215:
  *pc = uVar1;
  *pb = uVar4;
  return;
switchD_001070aa_default:
  uVar1 = uVar1 + *(uint *)((long)key + 8);
  uVar4 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^ (uVar4 + *key) - uVar1;
  iVar2 = uVar1 + uVar7 + *(uint *)((long)key + 4);
  uVar7 = (uVar4 << 6 | uVar4 >> 0x1a) ^ (uVar7 + *(uint *)((long)key + 4)) - uVar4;
  iVar6 = uVar4 + iVar2;
  uVar1 = (uVar7 << 8 | uVar7 >> 0x18) ^ iVar2 - uVar7;
  iVar8 = uVar7 + iVar6;
  uVar4 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar6 - uVar1;
  iVar2 = uVar1 + iVar8;
  uVar7 = (uVar4 << 0x13 | uVar4 >> 0xd) ^ iVar8 - uVar4;
  uVar4 = uVar4 + iVar2;
  uVar1 = (uVar7 << 4 | uVar7 >> 0x1c) ^ iVar2 - uVar7;
  size = size - 0xc;
  key = (void *)((long)key + 0xc);
  uVar7 = uVar7 + uVar4;
  goto LAB_00106e8f;
switchD_00106f98_default:
  uVar1 = uVar1 + *(uint *)((long)key + 8);
  uVar4 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^ (uVar4 + *key) - uVar1;
  iVar2 = uVar1 + uVar7 + *(uint *)((long)key + 4);
  uVar7 = (uVar4 << 6 | uVar4 >> 0x1a) ^ (uVar7 + *(uint *)((long)key + 4)) - uVar4;
  iVar6 = uVar4 + iVar2;
  uVar1 = (uVar7 << 8 | uVar7 >> 0x18) ^ iVar2 - uVar7;
  iVar8 = uVar7 + iVar6;
  uVar4 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar6 - uVar1;
  iVar2 = uVar1 + iVar8;
  uVar7 = (uVar4 << 0x13 | uVar4 >> 0xd) ^ iVar8 - uVar4;
  uVar4 = uVar4 + iVar2;
  uVar1 = (uVar7 << 4 | uVar7 >> 0x1c) ^ iVar2 - uVar7;
  size = size - 0xc;
  key = (void *)((long)key + 0xc);
  uVar7 = uVar7 + uVar4;
  goto LAB_00106f14;
switchD_001070aa_caseD_2:
  uVar5 = (uint)(ushort)*key;
LAB_001071a8:
  uVar5 = uVar5 + uVar4;
LAB_001071ca:
  uVar1 = (uVar1 ^ uVar7) - (uVar7 << 0xe | uVar7 >> 0x12);
  uVar4 = (uVar5 ^ uVar1) - (uVar1 * 0x800 | uVar1 >> 0x15);
  uVar7 = (uVar7 ^ uVar4) - (uVar4 * 0x2000000 | uVar4 >> 7);
  uVar1 = (uVar1 ^ uVar7) - (uVar7 * 0x10000 | uVar7 >> 0x10);
  uVar4 = (uVar4 ^ uVar1) - (uVar1 * 0x10 | uVar1 >> 0x1c);
  uVar7 = (uVar7 ^ uVar4) - (uVar4 * 0x4000 | uVar4 >> 0x12);
  uVar1 = (uVar1 ^ uVar7) - (uVar7 * 0x1000000 | uVar7 >> 8);
switchD_001070aa_caseD_0:
  uVar4 = uVar7;
  goto LAB_00107215;
}

Assistant:

void jlu32lpair(const void *key, size_t size, uint32_t *pc, uint32_t *pb)
{
    union { const void *ptr; size_t i; } u;
    uint32_t a = _JLU3_INIT(*pc, size);
    uint32_t b = a;
    uint32_t c = a;

    if (key == NULL)
	goto exit;

    c += *pb;	/* Add the secondary hash. */

    u.ptr = key;
    if (HASH_LITTLE_ENDIAN && ((u.i & 0x3) == 0)) {
	const uint32_t *k = (const uint32_t *)key;	/* read 32-bit chunks */
#ifdef	VALGRIND
	const uint8_t  *k8;
#endif

	/*-- all but last block: aligned reads and affect 32 bits of (a,b,c) */
	while (size > (size_t)12) {
	    a += k[0];
	    b += k[1];
	    c += k[2];
	    _JLU3_MIX(a,b,c);
	    size -= 12;
	    k += 3;
	}
	/*------------------------- handle the last (probably partial) block */
	/* 
	 * "k[2]&0xffffff" actually reads beyond the end of the string, but
	 * then masks off the part it's not allowed to read.  Because the
	 * string is aligned, the masked-off tail is in the same word as the
	 * rest of the string.  Every machine with memory protection I've seen
	 * does it on word boundaries, so is OK with this.  But VALGRIND will
	 * still catch it and complain.  The masking trick does make the hash
	 * noticeably faster for short strings (like English words).
	 */
#ifndef VALGRIND

	switch (size) {
	case 12:	c += k[2]; b+=k[1]; a+=k[0]; break;
	case 11:	c += k[2]&0xffffff; b+=k[1]; a+=k[0]; break;
	case 10:	c += k[2]&0xffff; b+=k[1]; a+=k[0]; break;
	case  9:	c += k[2]&0xff; b+=k[1]; a+=k[0]; break;
	case  8:	b += k[1]; a+=k[0]; break;
	case  7:	b += k[1]&0xffffff; a+=k[0]; break;
	case  6:	b += k[1]&0xffff; a+=k[0]; break;
	case  5:	b += k[1]&0xff; a+=k[0]; break;
	case  4:	a += k[0]; break;
	case  3:	a += k[0]&0xffffff; break;
	case  2:	a += k[0]&0xffff; break;
	case  1:	a += k[0]&0xff; break;
	case  0:	goto exit;
	}

#else /* make valgrind happy */

	k8 = (const uint8_t *)k;
	switch (size) {
	case 12:	c += k[2]; b+=k[1]; a+=k[0];	break;
	case 11:	c += ((uint32_t)k8[10])<<16;	/* fallthrough */
	case 10:	c += ((uint32_t)k8[9])<<8;	/* fallthrough */
	case  9:	c += k8[8];			/* fallthrough */
	case  8:	b += k[1]; a+=k[0];		break;
	case  7:	b += ((uint32_t)k8[6])<<16;	/* fallthrough */
	case  6:	b += ((uint32_t)k8[5])<<8;	/* fallthrough */
	case  5:	b += k8[4];			/* fallthrough */
	case  4:	a += k[0];			break;
	case  3:	a += ((uint32_t)k8[2])<<16;	/* fallthrough */
	case  2:	a += ((uint32_t)k8[1])<<8;	/* fallthrough */
	case  1:	a += k8[0];			break;
	case  0:	goto exit;
	}

#endif /* !valgrind */

    } else if (HASH_LITTLE_ENDIAN && ((u.i & 0x1) == 0)) {
	const uint16_t *k = (const uint16_t *)key;	/* read 16-bit chunks */
	const uint8_t  *k8;

	/*----------- all but last block: aligned reads and different mixing */
	while (size > (size_t)12) {
	    a += k[0] + (((uint32_t)k[1])<<16);
	    b += k[2] + (((uint32_t)k[3])<<16);
	    c += k[4] + (((uint32_t)k[5])<<16);
	    _JLU3_MIX(a,b,c);
	    size -= 12;
	    k += 6;
	}

	/*------------------------- handle the last (probably partial) block */
	k8 = (const uint8_t *)k;
	switch (size) {
	case 12:
	    c += k[4]+(((uint32_t)k[5])<<16);
	    b += k[2]+(((uint32_t)k[3])<<16);
	    a += k[0]+(((uint32_t)k[1])<<16);
	    break;
	case 11:
	    c += ((uint32_t)k8[10])<<16;
	    /* fallthrough */
	case 10:
	    c += k[4];
	    b += k[2]+(((uint32_t)k[3])<<16);
	    a += k[0]+(((uint32_t)k[1])<<16);
	    break;
	case  9:
	    c += k8[8];
	    /* fallthrough */
	case  8:
	    b += k[2]+(((uint32_t)k[3])<<16);
	    a += k[0]+(((uint32_t)k[1])<<16);
	    break;
	case  7:
	    b += ((uint32_t)k8[6])<<16;
	    /* fallthrough */
	case  6:
	    b += k[2];
	    a += k[0]+(((uint32_t)k[1])<<16);
	    break;
	case  5:
	    b += k8[4];
	    /* fallthrough */
	case  4:
	    a += k[0]+(((uint32_t)k[1])<<16);
	    break;
	case  3:
	    a += ((uint32_t)k8[2])<<16;
	    /* fallthrough */
	case  2:
	    a += k[0];
	    break;
	case  1:
	    a += k8[0];
	    break;
	case  0:
	    goto exit;
	}

    } else {		/* need to read the key one byte at a time */
	const uint8_t *k = (const uint8_t *)key;

	/*----------- all but the last block: affect some 32 bits of (a,b,c) */
	while (size > (size_t)12) {
	    a += k[0];
	    a += ((uint32_t)k[1])<<8;
	    a += ((uint32_t)k[2])<<16;
	    a += ((uint32_t)k[3])<<24;
	    b += k[4];
	    b += ((uint32_t)k[5])<<8;
	    b += ((uint32_t)k[6])<<16;
	    b += ((uint32_t)k[7])<<24;
	    c += k[8];
	    c += ((uint32_t)k[9])<<8;
	    c += ((uint32_t)k[10])<<16;
	    c += ((uint32_t)k[11])<<24;
	    _JLU3_MIX(a,b,c);
	    size -= 12;
	    k += 12;
	}

	/*---------------------------- last block: affect all 32 bits of (c) */
	switch (size) {
	case 12:	c += ((uint32_t)k[11])<<24;	/* fallthrough */
	case 11:	c += ((uint32_t)k[10])<<16;	/* fallthrough */
	case 10:	c += ((uint32_t)k[9])<<8;	/* fallthrough */
	case  9:	c += k[8];			/* fallthrough */
	case  8:	b += ((uint32_t)k[7])<<24;	/* fallthrough */
	case  7:	b += ((uint32_t)k[6])<<16;	/* fallthrough */
	case  6:	b += ((uint32_t)k[5])<<8;	/* fallthrough */
	case  5:	b += k[4];			/* fallthrough */
	case  4:	a += ((uint32_t)k[3])<<24;	/* fallthrough */
	case  3:	a += ((uint32_t)k[2])<<16;	/* fallthrough */
	case  2:	a += ((uint32_t)k[1])<<8;	/* fallthrough */
	case  1:	a += k[0];
	    break;
	case  0:
	    goto exit;
	}
    }

    _JLU3_FINAL(a,b,c);

exit:
    *pc = c;
    *pb = b;
    return;
}